

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall cmLocalGenerator::GenerateTestFiles(cmLocalGenerator *this)

{
  Snapshot *this_00;
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  long lVar5;
  pointer ppcVar6;
  ulong uVar7;
  allocator local_339;
  Directory local_338;
  vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> children;
  string file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  string outP;
  string local_298;
  cmGeneratedFileStream fout;
  
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&fout,"CMAKE_TESTING_ENABLED",(allocator *)&local_338);
  bVar2 = cmMakefile::IsOn(pcVar1,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  if (bVar2) {
    configurationTypes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    configurationTypes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    configurationTypes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmMakefile::GetConfigurations(&local_298,this->Makefile,&configurationTypes,false);
    this_00 = &this->StateSnapshot;
    cmState::Snapshot::GetDirectory((Directory *)&fout,this_00);
    pcVar3 = cmState::Directory::GetCurrentBinary((Directory *)&fout);
    std::__cxx11::string::string((string *)&file,pcVar3,(allocator *)&local_338);
    std::__cxx11::string::append((char *)&file);
    std::__cxx11::string::append((char *)&file);
    cmGeneratedFileStream::cmGeneratedFileStream(&fout,file._M_dataplus._M_p,false);
    cmGeneratedFileStream::SetCopyIfDifferent(&fout,true);
    poVar4 = std::operator<<((ostream *)&fout,"# CMake generated Testfile for ");
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"# Source directory: ");
    cmState::Snapshot::GetDirectory(&local_338,this_00);
    pcVar3 = cmState::Directory::GetCurrentSource(&local_338);
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"# Build directory: ");
    cmState::Snapshot::GetDirectory((Directory *)&outP,this_00);
    pcVar3 = cmState::Directory::GetCurrentBinary((Directory *)&outP);
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"# ");
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"# This file includes the relevant testing commands ");
    poVar4 = std::operator<<(poVar4,"required for ");
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"# testing this directory and lists subdirectories to ");
    poVar4 = std::operator<<(poVar4,"be tested as well.");
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar1 = this->Makefile;
    std::__cxx11::string::string((string *)&local_338,"TEST_INCLUDE_FILE",(allocator *)&outP);
    pcVar3 = cmMakefile::GetProperty(pcVar1,(string *)&local_338);
    std::__cxx11::string::~string((string *)&local_338);
    if (pcVar3 != (char *)0x0) {
      poVar4 = std::operator<<((ostream *)&fout,"include(\"");
      poVar4 = std::operator<<(poVar4,pcVar3);
      poVar4 = std::operator<<(poVar4,"\")");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    pcVar1 = this->Makefile;
    for (ppcVar6 = (pcVar1->TestGenerators).
                   super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>._M_impl
                   .super__Vector_impl_data._M_start;
        ppcVar6 !=
        (pcVar1->TestGenerators).
        super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppcVar6 = ppcVar6 + 1) {
      cmTestGenerator::Compute(*ppcVar6,this);
      cmScriptGenerator::Generate
                (&(*ppcVar6)->super_cmScriptGenerator,(ostream *)&fout,&local_298,
                 &configurationTypes);
    }
    cmMakefile::GetStateSnapshot(this->Makefile);
    cmState::Snapshot::GetChildren(&children,(Snapshot *)&local_338);
    lVar5 = 0;
    for (uVar7 = 0;
        uVar7 < (ulong)(((long)children.
                               super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)children.
                              super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar7 = uVar7 + 1)
    {
      std::operator<<((ostream *)&fout,"subdirs(");
      cmState::Snapshot::GetDirectory
                (&local_338,
                 (Snapshot *)
                 ((long)&(children.
                          super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>.
                          _M_impl.super__Vector_impl_data._M_start)->State + lVar5));
      pcVar3 = cmState::Directory::GetCurrentBinary(&local_338);
      std::__cxx11::string::string((string *)&outP,pcVar3,&local_339);
      cmOutputConverter::Convert
                ((string *)&local_338,&this->super_cmOutputConverter,&outP,START_OUTPUT,UNCHANGED);
      std::operator<<((ostream *)&fout,(string *)&local_338);
      std::__cxx11::string::~string((string *)&local_338);
      poVar4 = std::operator<<((ostream *)&fout,")");
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)&outP);
      lVar5 = lVar5 + 0x18;
    }
    std::_Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::~_Vector_base
              (&children.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>);
    cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
    std::__cxx11::string::~string((string *)&file);
    std::__cxx11::string::~string((string *)&local_298);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&configurationTypes);
  }
  return;
}

Assistant:

void cmLocalGenerator::GenerateTestFiles()
{
  if ( !this->Makefile->IsOn("CMAKE_TESTING_ENABLED") )
    {
    return;
    }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes;
  const std::string& config =
    this->Makefile->GetConfigurations(configurationTypes, false);

  std::string file =
      this->StateSnapshot.GetDirectory().GetCurrentBinary();
  file += "/";
  file += "CTestTestfile.cmake";

  cmGeneratedFileStream fout(file.c_str());
  fout.SetCopyIfDifferent(true);

  fout << "# CMake generated Testfile for " << std::endl
       << "# Source directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentSource()
       << std::endl
       << "# Build directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentBinary()
       << std::endl
       << "# " << std::endl
       << "# This file includes the relevant testing commands "
       << "required for " << std::endl
       << "# testing this directory and lists subdirectories to "
       << "be tested as well." << std::endl;

  const char* testIncludeFile =
    this->Makefile->GetProperty("TEST_INCLUDE_FILE");
  if ( testIncludeFile )
    {
    fout << "include(\"" << testIncludeFile << "\")" << std::endl;
    }

  // Ask each test generator to write its code.
  std::vector<cmTestGenerator*> const&
    testers = this->Makefile->GetTestGenerators();
  for(std::vector<cmTestGenerator*>::const_iterator gi = testers.begin();
      gi != testers.end(); ++gi)
    {
    (*gi)->Compute(this);
    (*gi)->Generate(fout, config, configurationTypes);
    }
  size_t i;
  std::vector<cmState::Snapshot> children
      = this->Makefile->GetStateSnapshot().GetChildren();
  for(i = 0; i < children.size(); ++i)
    {
    // TODO: Use add_subdirectory instead?
    fout << "subdirs(";
    std::string outP = children[i].GetDirectory().GetCurrentBinary();
    fout << this->Convert(outP,START_OUTPUT);
    fout << ")" << std::endl;
    }
}